

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

void __thiscall ktx::CommandCreate::executeCreate(CommandCreate *this)

{
  Reporter *report;
  undefined1 *opts;
  ImageSpec *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char cVar4;
  bool testrun;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  KTXTexture2 texture;
  bool firstImage;
  OutputStream outputFile;
  uint32_t maxLevels;
  string writerScParams;
  string writer;
  MetricsCalculator metrics;
  path outputPath;
  anon_class_8_1_8991fb9c warningFn;
  ImageSpec firstImageSpec;
  ImageSpec target;
  KTXTexture2 local_278;
  bool local_269;
  undefined1 local_268 [40];
  ImageSpec *local_240;
  size_type local_238;
  undefined1 local_230 [24];
  ColorSpaceInfo local_218;
  string local_1e8;
  string local_1c8;
  MetricsCalculator local_1a8;
  undefined1 local_188 [32];
  anon_class_8_1_8991fb9c *local_168;
  uint32_t *puStack_160;
  ImageSpec *local_158;
  ColorSpaceInfo *pCStack_150;
  anon_class_8_1_8991fb9c local_140;
  ImageSpec local_138;
  undefined8 local_b8;
  undefined5 uStack_b0;
  undefined3 uStack_ab;
  undefined5 uStack_a8;
  undefined4 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  void *pvStack_60;
  undefined8 local_58;
  undefined7 uStack_50;
  undefined1 uStack_49;
  undefined7 uStack_48;
  undefined8 uStack_41;
  
  local_188._24_8_ = &local_278;
  local_168 = &local_140;
  local_278.handle_ = (ktxTexture2 *)0x0;
  this->targetChannelCount = (this->options).super_OptionsCreate.formatDesc.extended.channelCount;
  uStack_a8 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  uStack_ab = 0;
  local_a0 = 0xbf800000;
  local_90 = 0;
  local_88 = 0;
  local_78 = (void *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  pvStack_60 = (void *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_49 = 0;
  uStack_48 = 0;
  uStack_41 = 0;
  pCStack_150 = &local_218;
  local_218.dst.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  local_218.src.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  local_218.dst.transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_TransferFunction,_std::default_delete<const_TransferFunction>,_true,_true>
        )(__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0;
  local_218.src.usedTransferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
  local_218.src.usedPrimaries = KHR_DF_PRIMARIES_UNSPECIFIED;
  local_218.src.transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_TransferFunction,_std::default_delete<const_TransferFunction>,_true,_true>
        )(__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0;
  local_188._8_8_ = &local_269;
  local_269 = true;
  paVar2 = &local_138.formatDesc.extended.iccProfile.name.field_2;
  local_138.formatDesc.extended.channelCount = 0;
  local_138.formatDesc.extended.sameUnitAllChannels = false;
  local_138.formatDesc.basic._0_8_ = 0;
  local_138.formatDesc.basic._8_5_ = 0;
  local_138.formatDesc.basic._13_3_ = 0;
  local_138.formatDesc.extended.oeGamma = -1.0;
  local_138.formatDesc.extended.iccProfile.name._M_string_length = 0;
  local_138.formatDesc.extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  local_138.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_7_ = 0;
  local_138.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_138._112_7_ = 0;
  local_138._119_8_ = 0;
  puStack_160 = (uint32_t *)(local_230 + 0x14);
  local_230._20_4_ = 1;
  aVar5.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_b8;
  local_158 = &local_138;
  local_188._0_8_ = this;
  local_188._16_8_ = aVar5.values_;
  local_140.this = this;
  local_138.formatDesc.extended.iccProfile.name._M_dataplus._M_p = (pointer)paVar2;
  local_98 = &local_88;
  foreachImage<ktx::CommandCreate::executeCreate()::__1>
            (this,&(this->options).super_OptionsCreate.formatDesc,
             (anon_class_64_8_b01583d2 *)local_188);
  version_abi_cxx11_((string *)local_268,(ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,
                     testrun);
  local_188._0_8_ = (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
  local_188._8_8_ = (this->super_Command).super_Reporter.commandName._M_string_length;
  local_188._16_8_ = local_268._0_8_;
  local_188._24_8_ = local_268._8_8_;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x5;
  args.field_1.values_ = aVar5.values_;
  args.desc_ = (unsigned_long_long)local_188;
  ::fmt::v10::vformat_abi_cxx11_(&local_1c8,(v10 *)0x208eb9,fmt,args);
  pIVar1 = (ImageSpec *)(local_268 + 0x10);
  if ((ImageSpec *)local_268._0_8_ != pIVar1) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  ktxHashList_AddKVPair
            (&(local_278.handle_)->kvDataHead,"KTXwriter",(uint32_t)local_1c8._M_string_length + 1,
             local_1c8._M_dataplus._M_p);
  if ((this->options).super_OptionsCreate.swizzle.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    ktxHashList_AddKVPair
              (&(local_278.handle_)->kvDataHead,"KTXswizzle",
               *(int *)((long)&(this->options).super_OptionsCreate.swizzle.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 8) + 1,
               (this->options).super_OptionsCreate.swizzle.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_dataplus._M_p);
  }
  report = &(this->super_Command).super_Reporter;
  local_1a8.referenceNumChannels = 0;
  local_1a8.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts = &(this->options).super_OptionsEncodeCommon.field_0x29;
  MetricsCalculator::saveReferenceImages(&local_1a8,&local_278,(OptionsMetrics *)opts,report);
  if ((this->options).super_OptionsEncodeBasis<false>.codec != NONE) {
    encodeBasis(this,&local_278,&(this->options).super_OptionsEncodeBasis<false>);
  }
  if ((this->options).super_OptionsEncodeASTC.encodeASTC == true) {
    encodeASTC(this,&local_278,&(this->options).super_OptionsEncodeASTC);
  }
  MetricsCalculator::decodeAndCalculateMetrics(&local_1a8,&local_278,(OptionsMetrics *)opts,report);
  compress(this,&local_278,&(this->options).super_OptionsDeflate);
  local_188._0_8_ = (this->options).super_OptionsEncodeASTC.astcOptions._M_dataplus._M_p;
  local_188._8_8_ = (this->options).super_OptionsEncodeASTC.astcOptions._M_string_length;
  local_188._16_8_ = (this->options).super_OptionsEncodeBasis<false>.codecOptions._M_dataplus._M_p;
  local_188._24_8_ = (this->options).super_OptionsEncodeBasis<false>.codecOptions._M_string_length;
  local_168 = (anon_class_8_1_8991fb9c *)
              (this->options).super_OptionsEncodeCommon.commonOptions._M_dataplus._M_p;
  puStack_160 = (uint32_t *)(this->options).super_OptionsEncodeCommon.commonOptions._M_string_length
  ;
  local_158 = (ImageSpec *)(this->options).super_OptionsDeflate.compressOptions._M_dataplus._M_p;
  pCStack_150 = (ColorSpaceInfo *)
                (this->options).super_OptionsDeflate.compressOptions._M_string_length;
  fmt_00.size_ = 0xdddd;
  fmt_00.data_ = (char *)0x8;
  args_00.field_1.args_ = aVar5.args_;
  args_00.desc_ = (unsigned_long_long)local_188;
  ::fmt::v10::vformat_abi_cxx11_(&local_1e8,(v10 *)0x20e621,fmt_00,args_00);
  if ((pointer)local_1e8._M_string_length != (pointer)0x0) {
    if (*local_1e8._M_dataplus._M_p != ' ') {
      __assert_fail("writerScParams[0] == \' \'",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                    ,0x73e,"void ktx::CommandCreate::executeCreate()");
    }
    ktxHashList_AddKVPair
              (&(local_278.handle_)->kvDataHead,"KTXwriterScParams",local_1e8._M_string_length,
               local_1e8._M_dataplus._M_p + 1);
  }
  pcVar3 = (this->options).super_OptionsMultiInSingleOut.outputFilepath._M_dataplus._M_p;
  local_240 = (ImageSpec *)local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar3,
             pcVar3 + (this->options).super_OptionsMultiInSingleOut.outputFilepath._M_string_length)
  ;
  if (local_240 == (ImageSpec *)local_230) {
    local_268._24_8_ = local_230._8_8_;
    local_268._0_8_ = pIVar1;
  }
  else {
    local_268._0_8_ = local_240;
  }
  local_268._17_7_ = local_230._1_7_;
  local_268[0x10] = local_230[0];
  local_268._8_8_ = local_238;
  local_238 = 0;
  local_230[0] = 0;
  local_240 = (ImageSpec *)local_230;
  std::filesystem::__cxx11::path::path((path *)local_188,(string_type *)local_268,auto_format);
  if ((ImageSpec *)local_268._0_8_ != pIVar1) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if (local_240 != (ImageSpec *)local_230) {
    operator_delete(local_240,CONCAT71(local_230._1_7_,local_230[0]) + 1);
  }
  cVar4 = std::filesystem::__cxx11::path::has_parent_path();
  if (cVar4 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories((path *)local_268);
    std::filesystem::__cxx11::path::~path((path *)local_268);
  }
  OutputStream::OutputStream
            ((OutputStream *)local_268,&(this->options).super_OptionsMultiInSingleOut.outputFilepath
             ,report);
  OutputStream::writeKTX2((OutputStream *)local_268,(ktxTexture *)local_278.handle_,report);
  OutputStream::~OutputStream((OutputStream *)local_268);
  std::filesystem::__cxx11::path::~path((path *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::vector<basisu::image,_std::allocator<basisu::image>_>::~vector(&local_1a8.referenceImages);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_138.formatDesc.samples.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.formatDesc.samples.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT17(local_138.formatDesc.samples.
                             super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                             local_138.formatDesc.samples.
                             super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_) -
                    (long)local_138.formatDesc.samples.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.formatDesc.extended.iccProfile.profile.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.formatDesc.extended.iccProfile.profile.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.formatDesc.extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.formatDesc.extended.iccProfile.profile.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.formatDesc.extended.iccProfile.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_138.formatDesc.extended.iccProfile.name._M_dataplus._M_p,
                    CONCAT71(local_138.formatDesc.extended.iccProfile.name.field_2.
                             _M_allocated_capacity._1_7_,
                             local_138.formatDesc.extended.iccProfile.name.field_2._M_local_buf[0])
                    + 1);
  }
  if ((_Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
      local_218.dst.colorPrimaries._M_t.
      super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
      super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
      super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl != (ColorPrimaries *)0x0) {
    operator_delete((void *)local_218.dst.colorPrimaries._M_t.
                            super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
                            .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl,0x48)
    ;
  }
  local_218.dst.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  if (local_218.dst.transferFunction._M_t.
      super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
      .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0) {
    (*(*(_func_int ***)
        local_218.dst.transferFunction._M_t.
        super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
        .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl)[3])();
  }
  local_218.dst.transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_TransferFunction,_std::default_delete<const_TransferFunction>,_true,_true>
        )(__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0;
  if (local_218.src.colorPrimaries._M_t.
      super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
      super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
      super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0) {
    operator_delete((void *)local_218.src.colorPrimaries._M_t.
                            super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
                            .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl,0x48)
    ;
  }
  local_218.src.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  if (local_218.src.transferFunction._M_t.
      super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
      .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0) {
    (*(*(_func_int ***)
        local_218.src.transferFunction._M_t.
        super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
        .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl)[3])();
  }
  if (pvStack_60 != (void *)0x0) {
    operator_delete(pvStack_60,CONCAT17(uStack_49,uStack_50) - (long)pvStack_60);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_278.handle_ != (ktxTexture2 *)0x0) {
    (*(local_278.handle_)->vtbl->Destroy)((ktxTexture *)local_278.handle_);
  }
  return;
}

Assistant:

void CommandCreate::executeCreate() {
    const auto warningFn = [this](const std::string& w) { this->warning(w); };

    KTXTexture2 texture{nullptr};
    targetChannelCount = options.formatDesc.channelCount();

    ImageSpec target;
    ColorSpaceInfo colorSpaceInfo{};

    bool firstImage = true;
    ImageSpec firstImageSpec{};
    uint32_t maxLevels = 1;

    foreachImage(options.formatDesc, [&](
            const auto& inputFilepath,
            uint32_t levelIndex,
            uint32_t layerIndex,
            uint32_t faceIndex,
            uint32_t depthSliceIndex) {

        if (options.raw) {
            if (std::exchange(firstImage, false)) {
                target = ImageSpec{
                        options.width.value_or(1u),
                        options.height.value_or(1u),
                        options.depth.value_or(1u),
                        options.formatDesc};

                if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options.assignTF.has_value())
                    target.format().setTransfer(options.assignTF.value());

                if (options.assignPrimaries.has_value())
                    target.format().setPrimaries(options.assignPrimaries.value());

                if (options.assignTexcoordOrigin.has_value())
                    target.setOrigin(options.assignTexcoordOrigin.value());

                texture = createTexture(target);
            }

            const auto rawData = readRawFile(inputFilepath);

            const auto expectedFileSize = ktxTexture_GetImageSize(texture, levelIndex);
            if (rawData.size() != expectedFileSize)
                fatal(rc::INVALID_FILE, "Raw input file \"{}\" with {} bytes for level {} does not match the expected size of {} bytes.",
                        fmtInFile(inputFilepath), rawData.size(), levelIndex, expectedFileSize);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    reinterpret_cast<const ktx_uint8_t*>(rawData.data()),
                    rawData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
        } else {
            const auto inputImageFile = ImageInput::open(inputFilepath, nullptr, warningFn);
            inputImageFile->seekSubimage(0, 0); // Loading multiple subimage from the same input is not supported

            ImageSpec::Origin usedSourceOrigin;

            if (std::exchange(firstImage, false)) {
                uint32_t targetWidth, targetHeight;
                if (options.imageScale.has_value()) {
                    targetWidth = static_cast<uint32_t>(inputImageFile->spec().width()
                                                        * options.imageScale.value());
                    targetHeight = static_cast<uint32_t>(inputImageFile->spec().height()
                                                         * options.imageScale.value());
                    // TODO: scale depth
                } else {
                    targetWidth = options.width.value_or(inputImageFile->spec().width());
                    targetHeight = options.height.value_or(inputImageFile->spec().height());
                    // TODO: handle resampling depth
                }

                target = ImageSpec{
                    targetWidth,
                    targetHeight,
                    options.depth.value_or(1u),
                    options.formatDesc};

               if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options._1d && target.height() != 1)
                    fatal(rc::INVALID_FILE, "For --1d textures the input image height must be 1, but for \"{}\" it was {}.",
                            fmtInFile(inputFilepath), target.height());

                const auto maxDimension = std::max(target.width(), std::max(target.height(), baseDepth));
                maxLevels = log2(maxDimension) + 1;
                if (options.levels.value_or(1) > maxLevels) {
                    auto errorFmt = "Requested {} levels is too many. With {} {}x{} and depth {} the texture can only have {} levels at most.";
                    std::string baseExpl;
                    if (options.width.has_value() || options.height.has_value()) {
                        baseExpl = "a requested base image size of";
                    } else if (options.imageScale.has_value()) {
                        baseExpl = fmt::format(
                                           "base input image \"{}\" sized {}x{} * scale {} being",
                                           fmtInFile(inputFilepath), inputImageFile->spec().width(),
                                           inputImageFile->spec().height(),
                                           options.imageScale.value());
                    } else {
                        baseExpl = fmt::format("base input image \"{}\" sized", fmtInFile(inputFilepath));
                    }
                    fatal_usage(errorFmt, options.levels.value_or(1),
                                baseExpl,
                                target.width(), target.height(),
                                baseDepth, maxLevels);
                }

                checkNumInputImages();

                if (options.encodeASTC)
                    selectASTCMode(inputImageFile->spec().format().largestChannelBitLength());

                firstImageSpec = inputImageFile->spec();

                determineTargetColorSpace(*inputImageFile, target, colorSpaceInfo);
                determineTargetOrigin(*inputImageFile, target, usedSourceOrigin);
      
                texture = createTexture(target);
            } else {
                checkSpecsMatch(*inputImageFile, firstImageSpec);
                determineSourceColorSpace(*inputImageFile, colorSpaceInfo.src);
                determineSourceOrigin(*inputImageFile, usedSourceOrigin);
            }

            const uint32_t expectedImageWidth = std::max(firstImageSpec.width() >> levelIndex, 1u);
            const uint32_t expectedImageHeight = std::max(firstImageSpec.height() >> levelIndex, 1u);
            const uint32_t targetImageWidth = std::max(target.width() >> levelIndex, 1u);
            const uint32_t targetImageHeight = std::max(target.height() >> levelIndex, 1u);

            if (inputImageFile->spec().width() != expectedImageWidth || inputImageFile->spec().height() != expectedImageHeight) {
                const auto errorFmt = "Input image \"{}\" with size {}x{} does not match expected size {}x{} for level {}.";
                fatal(rc::INVALID_FILE, errorFmt, fmtInFile(inputFilepath),
                      inputImageFile->spec().width(),
                      inputImageFile->spec().height(),
                      // When no scaling option is specified image* == targetImage*.
                      expectedImageWidth, expectedImageHeight,
                      levelIndex);
            }
            auto image = loadInputImage(*inputImageFile);

            // Need to do color conversion if either the transfer functions or primaries don't
            // match. Primaries conversion requires decode to linear then reencode thus
            // transferFunctions are always required.
            if (target.format().transfer() != colorSpaceInfo.src.usedTransferFunction ||
                target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                assert((target.format().primaries() == colorSpaceInfo.src.usedPrimaries
                       || colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED)
                       && "determineSourceColorSpace failed to check for UNSPECIFIED.");
                const auto errorFmt = "Colorspace conversion requires unsupported {} {} {}.";
                if (colorSpaceInfo.src.transferFunction == nullptr) {
                    std::string source;
                    if (options.assignTF.has_value()) {
                        source = fmt::format("specified with --{}", options.kAssignTf);
                    } else {
                        source = fmt::format("used by input file \"{}\"", fmtInFile(inputFilepath));
                    }
                    auto errorMsg = fmt::format(errorFmt,
                                                "decode from",
                                                toString(colorSpaceInfo.src.usedTransferFunction),
                                                source);
                    if (!options.assignTF.has_value()) {
                        errorMsg += fmt::format(" Use an image processing tool to convert it or use"
                                                " --{}, with or without --{}, to specify handling.",
                                                options.kAssignTf, options.kConvertTf);
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (colorSpaceInfo.dst.transferFunction == nullptr) {
                    // If we get here it is because (a) a transfer supported for decode but not
                    // encode has been set with --assign-tf and (b) a primary conversion was
                    // requested with --convert-primaries. CLI checks prevent an unsupported
                    // transfer being given to --convert-tf.
                    auto source = fmt::format("specified with --{}", options.convertTF.has_value()
                                              ? options.kConvertTf : options.kAssignTf);
                    auto errorMsg = fmt::format(errorFmt,
                                                "encode to",
                                                toString(target.format().transfer()),
                                                source);
                    // Transfer functions derived from --format values are supported.
                    if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                        errorMsg += fmt::format(" Decode and encode with transfer function is"
                                                " required to convert primaries to {}.",
                                                toString(target.format().primaries()));
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (!options.noWarnOnColorConversions) {
                    if (target.format().model() == KHR_DF_MODEL_RGBSDA
                        && target.format().transfer() == KHR_DF_TRANSFER_LINEAR) {
                        uint32_t bitLength;
                        try {
                            bitLength = target.format().channelBitLength();
                        } catch(...) {
                            // This happens if channels have different bit length. Check just R.
                            // If format is something like RGB565, any channel length would fail
                            // the bitLength test so picking R doesn't matter.
                            bitLength = target.format().channelBitLength(KHR_DF_CHANNEL_RGBSDA_R);
                        }

                        if (bitLength < 14) {
                            // Per Poynton, >= 14 bits is enough to handle all transitions
                            // visible to a human
                            if (colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_SRGB
                               || colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_ITU) {
                              warning("Input file \"{}\" is undergoing a visual lossy color conversion from {} "
                                      "to KHR_DF_TRANSFER_LINEAR. Specify an _SRGB format with --{} to prevent "
                                      "this warning.",
                                      fmtInFile(inputFilepath),
                                      toString(colorSpaceInfo.src.usedTransferFunction),
                                      options.kFormat);
                            }
                        }
                    }
                }
                if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                //if (colorSpaceInfo.dst.colorPrimaries != nullptr) {
                    //assert(colorSpaceInfo.src.colorPrimaries != nullptr);
                    auto primaryTransform = colorSpaceInfo.src.colorPrimaries->transformTo(*colorSpaceInfo.dst.colorPrimaries);

                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function with primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction, &primaryTransform);
                } else {
                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function without primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction);
                }
            }

            // TODO: Add auto conversion and warning? Not needed now
            // because all supported source formats provide top-left images.

            if (image->getWidth() != targetImageWidth || image->getHeight() != targetImageHeight)
                image = scaleImage(std::move(image), targetImageWidth, targetImageHeight);

            if (target.origin() != usedSourceOrigin) {
                    if (options.failOnOriginChanges)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need to be y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                    if (options.warnOnOriginChanges)
                        warning("Input file \"{}\" is y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                // Only difference allowed by CLI is y down or y up.
                image->yflip();
            }

            if (options.normalize) {
                if (target.format().transfer() != KHR_DF_TRANSFER_UNSPECIFIED && target.format().transfer() != KHR_DF_TRANSFER_LINEAR) {
                    // Report source of problematic TF.
                    //
                    // If --format is an SRGB format
                    // - a fatal usage error will already have been thrown so nothing to do.
                    // If --format is non-SRGB format
                    // - absent TF options, an implicit conversion to LINEAR takes place if the file
                    //   TF is not LINEAR or UNSPECIFIED. If it can't be converted a fatal
                    //   unsupported conversion error will already have been thrown. Therefore
                    //   nothing to do. But if `create` is changed to set the TF for non-SRGB
                    //   formats from the file's TF then this error handling will need updating.
                    // - --assign-tf has many other possible values so that is a possible source.
                    // - --convert-tf can only be linear or srgb. If it's srgb and the format does
                    //   not have an equivalent SRGB format, that is another possible source.

                    //const auto input_error_message = "Input file \"{}\" The transfer function to be applied to the created texture is neither linear nor none. Normalize is only available for these transfer functions.";
                    //const auto inputTransfer =  inputImageFile->spec().format().transfer();
                    //bool is_file_error = (inputTransfer != KHR_DF_TRANSFER_UNSPECIFIED && inputTransfer != KHR_DF_TRANSFER_LINEAR);
                    const auto option_error_message = "--{} value is {}. Normalize can only be used if the transfer function is linear or none.";
                    if (options.convertTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kConvertTf,
                                    toString(options.convertTF.value()));
                    } else if (options.assignTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kAssignTf,
                                    toString(options.assignTF.value()));
                    }
                    assert(false && "target.format().transfer() is not suitable for --normalize though --assign-tf and --conver-tf were not used.");
                }
                image->normalize();
            }

            if (options.swizzleInput)
                image->swizzle(*options.swizzleInput);

            const auto imageData = convert(image, options.vkFormat, *inputImageFile);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    imageData.data(),
                    imageData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;

            if (options.mipmapGenerate) {
                uint32_t numMipLevels = options.levels.value_or(maxLevels);
                generateMipLevels(texture, std::move(image), *inputImageFile, numMipLevels, layerIndex, faceIndex, depthSliceIndex);
            }
        }
    });

    // Add KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXswizzle metadata
    if (options.swizzle) {
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_SWIZZLE_KEY,
                static_cast<uint32_t>(options.swizzle->size() + 1), // +1 to include the \0
                options.swizzle->c_str());
    }

    // Encode and apply compression

    MetricsCalculator metrics;
    metrics.saveReferenceImages(texture, options, *this);

    if (options.codec != BasisCodec::NONE)
        encodeBasis(texture, options);
    if (options.encodeASTC)
        encodeASTC(texture, options);

    metrics.decodeAndCalculateMetrics(texture, options, *this);

    compress(texture, options);

    // Add KTXwriterScParams metadata if ASTC encoding, BasisU encoding, or other supercompression was used
    const auto writerScParams = fmt::format("{}{}{}{}", options.astcOptions, options.codecOptions, options.commonOptions, options.compressOptions);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}